

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

EVaction INT_EVassoc_split_action(CManager_conflict cm,EVstone stone_num,EVstone *target_stone_list)

{
  void **ppvVar1;
  undefined8 *puVar2;
  attr_list *pp_Var3;
  uint uVar4;
  event_path_data evp;
  int iVar5;
  stone_type stone;
  _proto_action *p_Var6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  FILE *__stream;
  uint uVar10;
  
  evp = cm->evp;
  stone = stone_struct(evp,stone_num);
  if (stone == (stone_type)0x0) {
    return -1;
  }
  uVar4 = stone->proto_action_count;
  lVar9 = (long)(int)uVar4;
  p_Var6 = (_proto_action *)INT_CMrealloc(stone->proto_actions,lVar9 * 0x60 + 0x60);
  stone->proto_actions = p_Var6;
  *(undefined8 *)(p_Var6 + lVar9) = 0;
  p_Var6[lVar9].input_format_requirements = (FMStructDescList)0x0;
  p_Var6[lVar9].matching_reference_formats = (FMFormat *)0x0;
  (((anon_union_48_6_c1ce387a_for_o *)(&p_Var6[lVar9].matching_reference_formats + 1))->term).
  handler = (EVSimpleHandlerFunc)0x0;
  ppvVar1 = &p_Var6[lVar9].o.term.client_data;
  *ppvVar1 = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  puVar2 = (undefined8 *)((long)&p_Var6[lVar9].o + 0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  pp_Var3 = &p_Var6[lVar9].o.bri.remote_contact;
  *pp_Var3 = (attr_list)0x0;
  pp_Var3[1] = (attr_list)0x0;
  p_Var6[lVar9].attrs = (attr_list)0x0;
  (&p_Var6[lVar9].attrs)[1] = (attr_list)0x0;
  stone->proto_actions[lVar9].action_type = Action_Split;
  if (target_stone_list == (EVstone *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0xffffffff;
    piVar7 = target_stone_list;
    do {
      uVar10 = uVar10 + 1;
      iVar5 = *piVar7;
      piVar7 = piVar7 + 1;
    } while (iVar5 != -1);
  }
  __stream = (FILE *)cm->CMTrace_file;
  if (__stream == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,EVerbose);
    if (iVar5 == 0) goto LAB_0012f24e;
    __stream = (FILE *)cm->CMTrace_file;
  }
  else if (CMtrace_val[10] == 0) goto LAB_0012f24e;
  fprintf(__stream,"Adding Split action %d to ",(ulong)uVar4);
  fprint_stone_identifier(cm->CMTrace_file,evp,stone_num);
  fprintf((FILE *)cm->CMTrace_file,", %d target stones -> ",(ulong)uVar10);
  if (uVar10 != 0) {
    uVar8 = 0;
    do {
      fprintf((FILE *)cm->CMTrace_file,"%x, ",(ulong)(uint)target_stone_list[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  fputc(10,(FILE *)cm->CMTrace_file);
LAB_0012f24e:
  if (uVar10 != 0) {
    uVar8 = 0;
    do {
      INT_EVstone_add_split_target(cm,stone_num,target_stone_list[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  stone->output_count = uVar10;
  stone->default_action = uVar4;
  stone->proto_action_count = stone->proto_action_count + 1;
  stone->response_cache_count = 0;
  if (stone->response_cache != (response_cache_element *)0x0) {
    free_response_cache(stone);
  }
  stone->response_cache = (response_cache_element *)0x0;
  return uVar4;
}

Assistant:

extern EVaction
INT_EVassoc_split_action(CManager cm, EVstone stone_num, 
		     EVstone *target_stone_list)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int action_num;
    int target_count = 0, i;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[action_num].action_type = Action_Split;
    while (target_stone_list && (target_stone_list[target_count] != -1)) {
	target_count++;
    }
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Adding Split action %d to ", action_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_num);
	fprintf(cm->CMTrace_file, ", %d target stones -> ", target_count);
	for (i=0; i < target_count; i++) {
	    fprintf(cm->CMTrace_file, "%x, ", target_stone_list[i]);
	}
	fprintf(cm->CMTrace_file, "\n");
    }
    for (i=0; i < target_count; i++) {
	INT_EVstone_add_split_target(cm, stone_num, target_stone_list[i]);
    }
    stone->output_count = target_count;
    stone->default_action = action_num;
    stone->proto_action_count++;
    clear_response_cache(stone);
    return action_num;
}